

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SizeRange::SharedCtor(SizeRange *this)

{
  SizeRange *this_local;
  
  memset(&this->lowerbound_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SizeRange::SharedCtor() {
  ::memset(&lowerbound_, 0, reinterpret_cast<char*>(&upperbound_) -
    reinterpret_cast<char*>(&lowerbound_) + sizeof(upperbound_));
  _cached_size_ = 0;
}